

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::rows(Fl_Table *this,int val)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int local_2c;
  uint local_20;
  int now_size;
  int default_h;
  int oldrows;
  int val_local;
  Fl_Table *this_local;
  
  iVar1 = this->_rows;
  this->_rows = val;
  uVar2 = IntVector::size(&this->_rowheights);
  if (uVar2 == 0) {
    local_2c = 0x19;
  }
  else {
    local_2c = IntVector::back(&this->_rowheights);
  }
  local_20 = IntVector::size(&this->_rowheights);
  IntVector::size(&this->_rowheights,val);
  while ((int)local_20 < val) {
    piVar3 = IntVector::operator[](&this->_rowheights,local_20);
    *piVar3 = local_2c;
    local_20 = local_20 + 1;
  }
  table_resized(this);
  if ((val < iVar1) || (iVar1 <= this->botrow)) {
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return;
}

Assistant:

void Fl_Table::rows(int val) {
  int oldrows = _rows;
  _rows = val;
  {
    int default_h = ( _rowheights.size() > 0 ) ? _rowheights.back() : 25;
    int now_size = _rowheights.size();
    _rowheights.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _rowheights[now_size++] = default_h;	// fill new
    }
  }
  table_resized();
  
  // OPTIMIZATION: redraw only if change is visible.
  if ( val >= oldrows && oldrows > botrow ) {
    // NO REDRAW
  } else {
    redraw();
  }
}